

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

natwm_error map_insert(map *map,void *key,void *value)

{
  uint32_t hash_00;
  size_t sVar1;
  natwm_error error;
  uint32_t hash;
  size_t key_size;
  map_entry *entry;
  void *value_local;
  void *key_local;
  map *map_local;
  
  if (key == (void *)0x0) {
    map_local._4_4_ = GENERIC_ERROR;
  }
  else {
    key_size = 0;
    entry = (map_entry *)value;
    value_local = key;
    key_local = map;
    sVar1 = (*map->key_size_function)(key);
    hash_00 = (**(code **)((long)key_local + 0x38))(value_local,sVar1);
    map_local._4_4_ = entry_init(hash_00,value_local,entry,(map_entry **)&key_size);
    if (map_local._4_4_ == NO_ERROR) {
      map_local._4_4_ = map_insert_entry((map *)key_local,(map_entry *)key_size);
    }
  }
  return map_local._4_4_;
}

Assistant:

enum natwm_error map_insert(struct map *map, const void *key, void *value)
{
        if (key == NULL) {
                return GENERIC_ERROR;
        }

        struct map_entry *entry = NULL;
        size_t key_size = map->key_size_function(key);
        uint32_t hash = map->hash_function(key, key_size);
        enum natwm_error error = entry_init(hash, key, value, &entry);

        if (error != NO_ERROR) {
                return error;
        }

        return map_insert_entry(map, entry);
}